

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_data.cpp
# Opt level: O3

void __thiscall duckdb::ErrorData::ConvertErrorToJSON(ErrorData *this)

{
  if (((this->raw_message)._M_string_length != 0) && (*(this->raw_message)._M_dataplus._M_p == '{'))
  {
    return;
  }
  ConvertErrorToJSON();
  return;
}

Assistant:

void ErrorData::ConvertErrorToJSON() {
	if (!raw_message.empty() && raw_message[0] == '{') {
		// empty or already JSON
		return;
	}
	raw_message = StringUtil::ExceptionToJSONMap(type, raw_message, extra_info);
	final_message = raw_message;
}